

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O2

void __thiscall Http2::FrameWriter::FrameWriter(FrameWriter *this)

{
  Frame::Frame(&this->frame);
  return;
}

Assistant:

FrameWriter::FrameWriter()
{
}